

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

QRegion __thiscall QTreeView::visualRegionForSelection(QTreeView *this,QItemSelection *selection)

{
  QTreeViewPrivate *this_00;
  QWidgetData *pQVar1;
  QAbstractItemModel *pQVar2;
  Representation RVar3;
  undefined4 uVar4;
  bool bVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  Representation RVar9;
  Representation RVar10;
  long in_RDX;
  undefined8 in_R9;
  QItemSelectionRange *range;
  QItemSelectionRange *this_01;
  QItemSelectionRange *pQVar11;
  long in_FS_OFFSET;
  QPersistentModelIndex *this_02;
  undefined1 local_e8 [12];
  Representation RStack_dc;
  undefined1 local_d8 [12];
  Representation RStack_cc;
  QAbstractItemModel *local_c8;
  undefined1 local_b8 [16];
  QModelIndex local_a8;
  QModelIndex local_88;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDX + 0x10) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QRegion::QRegion((QRegion *)this);
      return (QRegion)(QRegionData *)this;
    }
  }
  else {
    this_00 = (QTreeViewPrivate *)(selection->super_QList<QItemSelectionRange>).d.ptr;
    *(undefined1 **)
     &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget =
         &DAT_aaaaaaaaaaaaaaaa;
    QRegion::QRegion((QRegion *)this);
    pQVar1 = ((this_00->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->
             data;
    local_48.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
    local_48.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
    local_48.x1.m_i = 0;
    local_48.y1.m_i = 0;
    if (*(long *)(in_RDX + 0x10) != 0) {
      this_01 = *(QItemSelectionRange **)(in_RDX + 8);
      pQVar11 = this_01 + *(long *)(in_RDX + 0x10);
      do {
        bVar5 = QItemSelectionRange::isValid(this_01);
        if (bVar5) {
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::parent();
          local_88.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_88.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&this_01->tl);
          pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
          iVar7 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,&local_68);
          if (((-1 < local_88.r) && (-1 < (long)local_88._0_8_)) &&
             (local_88.m.ptr != (QAbstractItemModel *)0x0)) {
            while (cVar6 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x2c].
                                        super_QArrayData)(selection,&local_88), cVar6 != '\0') {
              if (local_88.c + 1 < iVar7) {
                pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
                (**(code **)(*(long *)pQVar2 + 0x60))
                          (&local_a8,pQVar2,local_88._0_8_ & 0xffffffff,local_88.c + 1,&local_68);
                local_88.m.ptr = local_a8.m.ptr;
                local_88._0_8_ = local_a8._0_8_;
                local_88.i = local_a8.i;
              }
              else {
                local_88.i = 0;
                local_88.m.ptr = (QAbstractItemModel *)0x0;
                local_88._0_8_ = (undefined1 *)0xffffffffffffffff;
              }
              if (((local_88.r < 0) || ((long)local_88._0_8_ < 0)) ||
                 (local_88.m.ptr == (QAbstractItemModel *)0x0)) break;
            }
          }
          if (((-1 < local_88.r) && (-1 < (long)local_88._0_8_)) &&
             (local_88.m.ptr != (QAbstractItemModel *)0x0)) {
            local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_b8 = (undefined1  [16])
                       QTreeViewPrivate::visualRect(this_00,&local_88,SingleSection);
            uVar4 = local_b8._4_4_;
            this_02 = &this_01->br;
            local_a8.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_a8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            local_a8.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
            QPersistentModelIndex::operator_cast_to_QModelIndex(&local_a8,this_02);
            while ((((-1 < local_a8.r && (-1 < (long)local_a8._0_8_)) &&
                    (local_a8.m.ptr != (QAbstractItemModel *)0x0)) &&
                   (cVar6 = (**(code **)&(selection->super_QList<QItemSelectionRange>).d.d[0x2c].
                                         super_QArrayData)(selection,&local_a8), cVar6 != '\0'))) {
              if (local_a8.c < 1) {
                local_a8.i = 0;
                local_a8.m.ptr = (QAbstractItemModel *)0x0;
                local_a8._0_8_ = (undefined1 *)0xffffffffffffffff;
              }
              else {
                pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
                (**(code **)(*(long *)pQVar2 + 0x60))
                          (local_d8,pQVar2,local_a8._0_8_ & 0xffffffff,local_a8.c + -1,&local_68,
                           in_R9,this,this_02);
                local_a8.m.ptr = local_c8;
                local_a8._0_8_ = local_d8._0_8_;
                local_a8.i = (quintptr)stack0xffffffffffffff30;
              }
            }
            if (((-1 < local_a8.r) && (-1 < (long)local_a8._0_8_)) &&
               (local_a8.m.ptr != (QAbstractItemModel *)0x0)) {
              stack0xffffffffffffff30 = &DAT_aaaaaaaaaaaaaaaa;
              local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
              _local_d8 = QTreeViewPrivate::visualRect(this_00,&local_a8,SingleSection);
              RVar10.m_i = RStack_cc.m_i;
              if ((int)uVar4 < RStack_cc.m_i) {
                RVar10.m_i = uVar4;
              }
              RVar3.m_i = RStack_cc.m_i;
              if (RStack_cc.m_i < (int)uVar4) {
                RVar3.m_i = uVar4;
              }
              bVar5 = QHeaderView::sectionsMoved(this_00->header);
              if (bVar5) {
                iVar7 = QPersistentModelIndex::column();
                iVar8 = QPersistentModelIndex::column();
                if (iVar7 <= iVar8) {
                  do {
                    local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                    stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
                    RVar9.m_i = QHeaderView::sectionViewportPosition
                                          ((QHeaderView *)
                                           (selection->super_QList<QItemSelectionRange>).d.ptr[0x59]
                                           .tl.d,iVar7);
                    iVar8 = QHeaderView::sectionSize
                                      ((QHeaderView *)
                                       (selection->super_QList<QItemSelectionRange>).d.ptr[0x59].tl.
                                       d,iVar7);
                    local_e8._4_4_ = RVar10.m_i;
                    local_e8._0_4_ = RVar9.m_i;
                    RStack_dc.m_i = RVar3.m_i;
                    local_e8._8_4_ = iVar8 + RVar9.m_i + -1;
                    cVar6 = QRect::intersects(&local_48);
                    if (cVar6 != '\0') {
                      QRegion::operator+=((QRegion *)this,(QRect *)local_e8);
                    }
                    iVar8 = QPersistentModelIndex::column();
                    bVar5 = iVar7 < iVar8;
                    iVar7 = iVar7 + 1;
                  } while (bVar5);
                }
              }
              else {
                local_e8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
                stack0xffffffffffffff20 = &DAT_aaaaaaaaaaaaaaaa;
                _local_e8 = (QRect)QRect::operator|((QRect *)local_b8,(QRect *)local_d8);
                QWidget::layoutDirection((QWidget *)selection);
                iVar7 = QPersistentModelIndex::column();
                RVar10.m_i = QHeaderView::sectionViewportPosition
                                       ((QHeaderView *)
                                        (selection->super_QList<QItemSelectionRange>).d.ptr[0x59].tl
                                        .d,iVar7);
                local_e8._0_4_ = RVar10.m_i;
                cVar6 = QRect::intersects(&local_48);
                if (cVar6 != '\0') {
                  QRegion::operator+=((QRegion *)this,(QRect *)local_e8);
                }
              }
            }
          }
        }
        this_01 = this_01 + 1;
      } while (this_01 != pQVar11);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (QRegion)(QRegionData *)this;
    }
  }
  __stack_chk_fail();
}

Assistant:

QRegion QTreeView::visualRegionForSelection(const QItemSelection &selection) const
{
    Q_D(const QTreeView);
    if (selection.isEmpty())
        return QRegion();

    QRegion selectionRegion;
    const QRect &viewportRect = d->viewport->rect();
    for (const auto &range : selection) {
        if (!range.isValid())
            continue;
        QModelIndex parent = range.parent();
        QModelIndex leftIndex = range.topLeft();
        int columnCount = d->model->columnCount(parent);
        while (leftIndex.isValid() && isIndexHidden(leftIndex)) {
            if (leftIndex.column() + 1 < columnCount)
                leftIndex = d->model->index(leftIndex.row(), leftIndex.column() + 1, parent);
            else
                leftIndex = QModelIndex();
        }
        if (!leftIndex.isValid())
            continue;
        const QRect leftRect = d->visualRect(leftIndex, QTreeViewPrivate::SingleSection);
        int top = leftRect.top();
        QModelIndex rightIndex = range.bottomRight();
        while (rightIndex.isValid() && isIndexHidden(rightIndex)) {
            if (rightIndex.column() - 1 >= 0)
                rightIndex = d->model->index(rightIndex.row(), rightIndex.column() - 1, parent);
            else
                rightIndex = QModelIndex();
        }
        if (!rightIndex.isValid())
            continue;
        const QRect rightRect = d->visualRect(rightIndex, QTreeViewPrivate::SingleSection);
        int bottom = rightRect.bottom();
        if (top > bottom)
            qSwap<int>(top, bottom);
        int height = bottom - top + 1;
        if (d->header->sectionsMoved()) {
            for (int c = range.left(); c <= range.right(); ++c) {
                const QRect rangeRect(columnViewportPosition(c), top, columnWidth(c), height);
                if (viewportRect.intersects(rangeRect))
                    selectionRegion += rangeRect;
            }
        } else {
            QRect combined = leftRect|rightRect;
            combined.setX(columnViewportPosition(isRightToLeft() ? range.right() : range.left()));
            if (viewportRect.intersects(combined))
                selectionRegion += combined;
        }
    }
    return selectionRegion;
}